

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree.c
# Opt level: O2

ion_bpp_err_t gatherRoot(ion_bpp_handle_t handle)

{
  ushort *puVar1;
  
  memcpy(*(void **)((long)handle + 0x98),*(void **)((long)handle + 0x38),
         (long)*(int *)((long)handle + 0x10) * 3);
  **(ushort **)((long)handle + 0x98) =
       (ushort)*(undefined4 *)*(ushort **)((long)handle + 0x98) & 0xfffe |
       **(ushort **)((long)handle + 0x38) & 1;
  puVar1 = *(ushort **)((long)handle + 0x38);
  *puVar1 = *puVar1 & 1;
  return (ion_bpp_err_t)puVar1;
}

Assistant:

static ion_bpp_err_t
gatherRoot(
	ion_bpp_handle_t handle
) {
	ion_bpp_h_node_t	*h = handle;
	ion_bpp_buffer_t	*gbuf;
	ion_bpp_buffer_t	*root;

	/* gather root to gbuf */
	root		= &h->root;
	gbuf		= &h->gbuf;
	memcpy(p(gbuf), root->p, 3 * h->sectorSize);
	leaf(gbuf)	= leaf(root);
	ct(root)	= 0;
	return bErrOk;
}